

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Integer_combination_iterator.h
# Opt level: O1

void __thiscall
Gudhi::coxeter_triangulation::Integer_combination_iterator::increment
          (Integer_combination_iterator *this)

{
  pointer puVar1;
  uint *puVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  
  puVar1 = (this->value_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar6 = 0xffffffff;
  do {
    iVar3 = (int)uVar6;
    uVar5 = iVar3 + 1;
    uVar6 = (ulong)uVar5;
    if (puVar1[uVar6] != 0) break;
  } while (uVar5 < this->k_);
  puVar2 = (this->bounds_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar8 = (ulong)(iVar3 + 2);
  uVar4 = puVar2[uVar8];
  if (puVar1[uVar8] == uVar4) {
    iVar3 = 0;
    do {
      if (uVar4 != 0) {
        iVar3 = iVar3 + puVar1[uVar6];
        puVar1[uVar6] = 0;
        uVar6 = uVar8;
      }
      uVar5 = (uint)uVar6;
      uVar8 = (ulong)((int)uVar8 + 1);
      uVar4 = puVar2[uVar8];
    } while (puVar1[uVar8] == uVar4);
    iVar3 = iVar3 + -1;
  }
  else {
    iVar3 = -1;
  }
  if ((uint)uVar8 < this->k_) {
    uVar4 = iVar3 + puVar1[uVar5];
    puVar1[uVar5] = 0;
    puVar1[uVar8] = puVar1[uVar8] + 1;
    uVar5 = *puVar2;
    if (uVar4 < uVar5) {
      uVar7 = 0;
    }
    else {
      uVar6 = 0;
      uVar8 = 1;
      do {
        uVar7 = uVar8;
        puVar1[uVar6] = uVar5;
        uVar4 = uVar4 - puVar2[uVar6];
        uVar5 = puVar2[uVar7];
        uVar6 = uVar7;
        uVar8 = (ulong)((int)uVar7 + 1);
      } while (uVar5 <= uVar4);
    }
    puVar1[uVar7] = uVar4;
    return;
  }
  this->is_end_ = true;
  return;
}

Assistant:

void increment() {
    uint j1 = 0;
    uint s = 0;
    while (value_[j1] == 0 && j1 < k_) j1++;
    uint j2 = j1 + 1;
    while (value_[j2] == bounds_[j2]) {
      if (bounds_[j2] != 0) {
        s += value_[j1];
        value_[j1] = 0;
        j1 = j2;
      }
      j2++;
    }
    if (j2 >= k_) {
      is_end_ = true;
      return;
    }
    s += value_[j1] - 1;
    value_[j1] = 0;
    value_[j2]++;
    uint i = 0;
    while (s >= bounds_[i]) {
      value_[i] = bounds_[i];
      s -= bounds_[i];
      i++;
    }
    value_[i++] = s;
  }